

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

void djgt__set_glpus(GLint *state)

{
  (*glad_glBindBuffer)(0x88ec,*state);
  (*glad_glPixelStorei)(0xcf0,state[1]);
  (*glad_glPixelStorei)(0xcf1,state[2]);
  (*glad_glPixelStorei)(0xcf2,state[3]);
  (*glad_glPixelStorei)(0x806e,state[4]);
  (*glad_glPixelStorei)(0xcf3,state[5]);
  (*glad_glPixelStorei)(0xcf4,state[6]);
  (*glad_glPixelStorei)(0x806d,state[7]);
  (*glad_glPixelStorei)(0xcf5,state[8]);
  return;
}

Assistant:

static void djgt__set_glpus(const djgt__glpss state)
{
    glBindBuffer(GL_PIXEL_UNPACK_BUFFER , state[0]);
    glPixelStorei(GL_UNPACK_SWAP_BYTES  , state[1]);
    glPixelStorei(GL_UNPACK_LSB_FIRST   , state[2]);
    glPixelStorei(GL_UNPACK_ROW_LENGTH  , state[3]);
    glPixelStorei(GL_UNPACK_IMAGE_HEIGHT, state[4]);
    glPixelStorei(GL_UNPACK_SKIP_ROWS   , state[5]);
    glPixelStorei(GL_UNPACK_SKIP_PIXELS , state[6]);
    glPixelStorei(GL_UNPACK_SKIP_IMAGES , state[7]);
    glPixelStorei(GL_UNPACK_ALIGNMENT   , state[8]);
}